

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

string * __thiscall
ApprovalTests::TestName::getOriginalFileName_abi_cxx11_
          (string *__return_storage_ptr__,TestName *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->originalFileName)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string TestName::getOriginalFileName()
    {
        return originalFileName;
    }